

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O0

int32 keycmp_case(hash_entry_t *entry,char *key)

{
  char *local_30;
  char *str;
  int32 i;
  char c2;
  char c1;
  char *key_local;
  hash_entry_t *entry_local;
  
  str._0_4_ = 0;
  local_30 = entry->key;
  _i = key;
  while( true ) {
    if (entry->len <= (ulong)(uint)str) {
      return 0;
    }
    if (*local_30 != *_i) break;
    str._0_4_ = (uint)str + 1;
    local_30 = local_30 + 1;
    _i = _i + 1;
  }
  return (int)*local_30 - (int)*_i;
}

Assistant:

static int32
keycmp_case(hash_entry_t * entry, const char *key)
{
    char c1, c2;
    int32 i;
    const char *str;

    str = entry->key;
    for (i = 0; (uint32)i < entry->len; i++) {
        c1 = *(str++);
        c2 = *(key++);
        if (c1 != c2)
            return (c1 - c2);
    }

    return 0;
}